

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

ecdh_key * ssh_ecdhkex_w_new(ssh_kex *kex,_Bool is_server)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  mp_int *lo;
  mp_int *pmVar4;
  WeierstrassPoint *pWVar5;
  undefined7 in_register_00000031;
  
  puVar1 = (undefined8 *)kex->extra;
  uVar2 = (*(code *)*puVar1)(kex,CONCAT71(in_register_00000031,is_server));
  puVar3 = (undefined8 *)safemalloc(1,0x28,0);
  *(anon_union_8_1_10d1415b_for_ssh_kex_5 *)(puVar3 + 4) = kex->field_4;
  *puVar3 = puVar1;
  puVar3[1] = uVar2;
  lo = mp_from_integer(1);
  pmVar4 = mp_random_in_range_fn(lo,*(mp_int **)(puVar3[1] + 0x40),random_read);
  puVar3[2] = pmVar4;
  mp_free(lo);
  pWVar5 = ecc_weierstrass_multiply(*(WeierstrassPoint **)(puVar3[1] + 0x38),(mp_int *)puVar3[2]);
  puVar3[3] = pWVar5;
  return (ecdh_key *)(puVar3 + 4);
}

Assistant:

ecdh_key *ssh_ecdhkex_w_new(const ssh_kex *kex, bool is_server)
{
    const struct eckex_extra *extra = (const struct eckex_extra *)kex->extra;
    const struct ec_curve *curve = extra->curve();

    ecdh_key_w *dhw = snew(ecdh_key_w);
    dhw->ek.vt = kex->ecdh_vt;
    dhw->extra = extra;
    dhw->curve = curve;

    mp_int *one = mp_from_integer(1);
    dhw->private = mp_random_in_range(one, dhw->curve->w.G_order);
    mp_free(one);

    dhw->w_public = ecc_weierstrass_multiply(dhw->curve->w.G, dhw->private);

    return &dhw->ek;
}